

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  pointer __src;
  undefined8 *puVar1;
  undefined8 *puVar2;
  ostream *poVar3;
  ulong uVar4;
  int i;
  uint uVar5;
  int iVar6;
  long lVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ESI;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_4c0;
  Array_Data_Symbol testing_symbol;
  Array_Data_Symbol D;
  Array_Data_Symbol source;
  Array_Data_Symbol local_340;
  LT_Encoding encoder;
  R10_Decoder decoder;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Raptor Codes Testing !");
  std::endl<char,std::char_traits<char>>(poVar3);
  Array_Data_Symbol::Array_Data_Symbol(&testing_symbol,0x400,1);
  iVar6 = 0;
  lVar7 = 0;
  for (uVar4 = 0; uVar4 < testing_symbol.K; uVar4 = uVar4 + 1) {
    if ((int)((uVar4 & 0xffffffff) / 3) * 3 + iVar6 != 0) {
      **(undefined1 **)
        ((long)&((testing_symbol.symbol.
                  super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl.
                  super__Vector_impl_data._M_start)->s).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + lVar7) = 1;
    }
    lVar7 = lVar7 + 0x20;
    iVar6 = iVar6 + -1;
  }
  LT_Encoding::LT_Encoding(&encoder,&testing_symbol);
  Array_Data_Symbol::Array_Data_Symbol(&D,testing_symbol.K,1);
  ESI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ESI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ESI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar5 = 0; uVar5 < testing_symbol.K + 3; uVar5 = uVar5 + 1) {
    decoder.sym_p._0_4_ = uVar5;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&ESI,(uint *)&decoder);
    decoder.sym_p._0_4_ = uVar5;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&D.ESIs,(uint *)&decoder);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4c0,&ESI);
  LT_Encoding::LTEnc_Generate
            ((vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_> *)&decoder,&encoder,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_4c0);
  std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::_M_move_assign(&D.symbol,&decoder)
  ;
  std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::~vector
            ((vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_> *)&decoder);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_4c0);
  R10_Decoder::R10_Decoder(&decoder,testing_symbol.K,1);
  std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::erase
            (&D.symbol,
             D.symbol.super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl.
             super__Vector_impl_data._M_start + 3);
  __src = D.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start + 4;
  if (__src != D.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish) {
    memmove(D.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start + 3,__src,
            (long)D.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src);
  }
  D.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       D.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish + -1;
  Array_Data_Symbol::Array_Data_Symbol(&local_340,&D);
  R10_Decoder::Get_Source_Symbol(&source,&decoder,&local_340,testing_symbol.K + 2);
  Array_Data_Symbol::~Array_Data_Symbol(&local_340);
  uVar4 = 0xffffffffffffffff;
  lVar7 = 0;
  do {
    uVar4 = uVar4 + 1;
    if ((ulong)((long)source.symbol.
                      super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)source.symbol.
                      super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5) <= uVar4) {
      poVar3 = std::operator<<((ostream *)&std::cout,"decode successfully!");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"total symbols: ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,"  redundancy rate: ");
      poVar3 = std::ostream::_M_insert<double>(0.0029296875);
      iVar6 = 0;
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_0010c845;
    }
    puVar1 = (undefined8 *)
             ((long)&((source.symbol.
                       super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl
                       .super__Vector_impl_data._M_start)->s).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar7);
    puVar2 = (undefined8 *)
             ((long)&((testing_symbol.symbol.
                       super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>._M_impl
                       .super__Vector_impl_data._M_start)->s).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar7);
    lVar7 = lVar7 + 0x20;
  } while ((bool)*(char *)*puVar1 == (*(char *)*puVar2 != '\0'));
  poVar3 = std::operator<<((ostream *)&std::cout,"decode fail!");
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar6 = -1;
LAB_0010c845:
  Array_Data_Symbol::~Array_Data_Symbol(&source);
  R10_Decoder::~R10_Decoder(&decoder);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&ESI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  Array_Data_Symbol::~Array_Data_Symbol(&D);
  LT_Encoding::~LT_Encoding(&encoder);
  Array_Data_Symbol::~Array_Data_Symbol(&testing_symbol);
  return iVar6;
}

Assistant:

int main(int argc, char const *argv[])
{
	std::cout << "Raptor Codes Testing !" << std::endl;	


    const int SYMBOL_LEN = 1;
    const int SYMBOL_SIZE = 1024;
    const int overhead = 3;


	class Array_Data_Symbol testing_symbol(SYMBOL_SIZE, SYMBOL_LEN);

	for (int i = 0; i < testing_symbol.K; ++i)
	{
		// if (i%2)
		// {
		// 	a.symbol[i].s[0] = 1;
		// }
		if (i%3)
		{
			testing_symbol.symbol[i].s[0] = 1;
		}		
	}




    class LT_Encoding encoder(&testing_symbol);


   	class Array_Data_Symbol D(testing_symbol.K, SYMBOL_LEN);

    std::vector<uint32_t> ESI;

    for (int i = 0; i < testing_symbol.K + overhead; ++i)
    {
    	ESI.push_back(i);
    	D.ESIs.push_back(i);
    }




    // for (int i = 0; i < ESI.size(); ++i)
    // {
    // 	printf("ESI: %d\n", ESI[i]);
    // }

	//printf("ESI: %d\n", ESI.size());

    D.symbol = encoder.LTEnc_Generate(ESI);


	class R10_Decoder decoder(testing_symbol.K, SYMBOL_LEN);

	// class Array_Data_Symbol C = decoder.Get_Inter_Symbols(D, testing_symbol.K);


 //    std::cout << "testing_symbol: " << std::endl;
 //    for (int i = 0; i < testing_symbol.K; ++i)
 //    {
 //        printf("%d ", testing_symbol.symbol[i].s[0]);
 //    }
 //    std::cout << std::endl;

 //     printf("D: \n");

 //    for (int i = 0; i < D.symbol.size(); ++i)
 //    {
 //        printf("%d ", D.symbol[i].s[0]);
 //    }
 //    printf("\n");

	// printf("C: \n");

	// for (int i = 0; i < C.symbol.size(); ++i)
	// {
	// 	printf("%d ", C.symbol[i].s[0]);
	// }
	// printf("\n");


    // decoder.Inter_Symbols_Decoding(C);

    // drop some symbols for testing
     int loss = 1;
    D.symbol.erase(D.symbol.begin() + 3);
    D.ESIs.erase(D.ESIs.begin() + 3);



   class Array_Data_Symbol source = decoder.Get_Source_Symbol(D, testing_symbol.K + overhead - loss);


    // printf("Source Symbol: \n");

    // for (int i = 0; i < source.symbol.size(); ++i)
    // {
    //     printf("%d ", source.symbol[i].s[0]);
    // }
    // printf("\n");


    // std::cout << "Testing Symbol: " << std::endl;
    // for (int i = 0; i < testing_symbol.K; ++i)
    // {
    //     printf("%d ", testing_symbol.symbol[i].s[0]);
    // }
    // std::cout << std::endl;


   for (int i = 0; i < source.symbol.size(); ++i)
   {
        if (source.symbol[i].s[0] ^ testing_symbol.symbol[i].s[0] != 0)
        {

             std::cout << "decode fail!" << std::endl;
             return -1;

        }

   }


    std::cout << "decode successfully!" << std::endl;
    std::cout <<  "total symbols: " << source.K <<"  redundancy rate: " <<  (float)overhead / (float)SYMBOL_SIZE <<std::endl;


	return 0;
}